

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  bool bVar1;
  char *pcVar2;
  TestInfo *in_RDX;
  char *in_RSI;
  string *in_RDI;
  string kTestsuite;
  TestResult *result;
  TestInfo *in_stack_fffffffffffffb38;
  TestResult *in_stack_fffffffffffffb40;
  allocator *paVar3;
  int *in_stack_fffffffffffffb68;
  char *local_468;
  string *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  allocator *in_stack_fffffffffffffc30;
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  string local_318 [16];
  TimeInMillis in_stack_fffffffffffffcf8;
  allocator local_2f1;
  string local_2f0 [32];
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  TestResult *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  TimeInMillis in_stack_fffffffffffffde8;
  allocator local_209;
  string local_208 [36];
  int local_1e4;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  undefined1 local_141 [40];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  undefined4 local_58;
  allocator local_41;
  string local_40 [32];
  TestResult *local_20;
  TestInfo *local_18;
  char *local_10;
  string *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = TestInfo::result(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"testcase",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar1 = TestInfo::is_in_another_shard(local_18);
  if (bVar1) {
    local_58 = 1;
  }
  else {
    std::operator<<((ostream *)local_8,"    <testcase");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"name",&local_79);
    pcVar2 = TestInfo::name((TestInfo *)0x16605c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,pcVar2,&local_a1);
    OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                       in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pcVar2 = TestInfo::value_param(in_stack_fffffffffffffb38);
    if (pcVar2 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"value_param",&local_c9);
      pcVar2 = TestInfo::value_param(in_stack_fffffffffffffb38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,pcVar2,&local_f1);
      OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    pcVar2 = TestInfo::type_param(in_stack_fffffffffffffb38);
    if (pcVar2 != (char *)0x0) {
      in_stack_fffffffffffffc30 = &local_119;
      in_stack_fffffffffffffc28 = local_8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"type_param",in_stack_fffffffffffffc30);
      in_stack_fffffffffffffc20 = (string *)TestInfo::type_param(in_stack_fffffffffffffb38);
      in_stack_fffffffffffffc18 = (string *)local_141;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_141 + 1),(char *)in_stack_fffffffffffffc20,
                 (allocator *)in_stack_fffffffffffffc18);
      OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string((string *)(local_141 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_141);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"file",&local_169);
    pcVar2 = TestInfo::file((TestInfo *)0x166520);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,pcVar2,&local_191);
    OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                       in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"line",&local_1b9);
    local_1e4 = TestInfo::line(local_18);
    StreamableToString<int>(in_stack_fffffffffffffb68);
    OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                       in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,"status",&local_209);
      bVar1 = TestInfo::should_run(local_18);
      pcVar2 = "notrun";
      if (bVar1) {
        pcVar2 = "run";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffdd0,pcVar2,(allocator *)&stack0xfffffffffffffdcf);
      OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdcf);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"result",&local_259);
      bVar1 = TestInfo::should_run(local_18);
      if (bVar1) {
        bVar1 = TestResult::Skipped(in_stack_fffffffffffffb40);
        local_468 = "completed";
        if (bVar1) {
          local_468 = "skipped";
        }
      }
      else {
        local_468 = "suppressed";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,local_468,&local_281);
      OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"time",&local_2a9);
      TestResult::elapsed_time(local_20);
      FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffcf8);
      OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      paVar3 = &local_2f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"timestamp",paVar3);
      TestResult::start_timestamp(local_20);
      FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffde8);
      OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_338,"classname",&local_339);
      paVar3 = &local_361;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_360,local_10,paVar3);
      OutputXmlAttribute((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                         in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      OutputXmlTestResult(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_58 = 0;
    }
    else {
      std::operator<<((ostream *)local_8," />\n");
      local_58 = 1;
    }
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
  OutputXmlAttribute(stream, kTestsuite, "line",
                     StreamableToString(test_info.line()));
  if (GTEST_FLAG_GET(list_tests)) {
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  OutputXmlTestResult(stream, result);
}